

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factor.hpp
# Opt level: O0

void __thiscall
CholeskyFactor::eliminate
          (CholeskyFactor *this,vector<double,_std::allocator<double>_> *m,HighsInt i,HighsInt j,
          HighsInt kmax,HighsInt currentk)

{
  double dVar1;
  double dVar2;
  double dVar3;
  value_type vVar4;
  value_type vVar5;
  reference pvVar6;
  int in_ECX;
  int in_EDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  long in_RDI;
  int in_R8D;
  double a_ik_3;
  HighsInt k_3;
  double a_ik_2;
  HighsInt k_2;
  double a_ik_1;
  HighsInt k_1;
  double a_ik;
  HighsInt k;
  double sin_;
  double cos_;
  double z;
  undefined4 local_6c;
  undefined4 local_5c;
  undefined4 local_4c;
  undefined4 local_3c;
  undefined8 local_38;
  undefined8 local_30;
  
  pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                     (in_RSI,(long)(in_ECX * in_R8D + in_EDX));
  if ((*pvVar6 != 0.0) || (NAN(*pvVar6))) {
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       (in_RSI,(long)(in_EDX * in_R8D + in_EDX));
    dVar1 = *pvVar6;
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       (in_RSI,(long)(in_EDX * in_R8D + in_EDX));
    dVar2 = *pvVar6;
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       (in_RSI,(long)(in_ECX * in_R8D + in_EDX));
    dVar3 = *pvVar6;
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       (in_RSI,(long)(in_ECX * in_R8D + in_EDX));
    local_38 = sqrt(dVar1 * dVar2 + dVar3 * *pvVar6);
    if ((local_38 != 0.0) || (NAN(local_38))) {
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         (in_RSI,(long)(in_EDX * in_R8D + in_EDX));
      local_30 = *pvVar6 / local_38;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         (in_RSI,(long)(in_ECX * in_R8D + in_EDX));
      local_38 = -*pvVar6 / local_38;
    }
    else {
      local_30 = 1.0;
      local_38 = 0.0;
    }
    if ((local_38 != 0.0) || (NAN(local_38))) {
      if ((local_30 != 0.0) || (NAN(local_30))) {
        for (local_6c = 0; local_6c < *(int *)(in_RDI + 0x18); local_6c = local_6c + 1) {
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                             (in_RSI,(long)(in_EDX * in_R8D + local_6c));
          dVar1 = *pvVar6;
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                             (in_RSI,(long)(in_ECX * in_R8D + local_6c));
          dVar2 = *pvVar6;
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                             (in_RSI,(long)(in_EDX * in_R8D + local_6c));
          *pvVar6 = local_30 * dVar1 + -(local_38 * dVar2);
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                             (in_RSI,(long)(in_ECX * in_R8D + local_6c));
          dVar2 = *pvVar6;
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                             (in_RSI,(long)(in_ECX * in_R8D + local_6c));
          *pvVar6 = local_38 * dVar1 + local_30 * dVar2;
        }
      }
      else if (local_38 <= 0.0) {
        for (local_5c = 0; local_5c < *(int *)(in_RDI + 0x18); local_5c = local_5c + 1) {
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                             (in_RSI,(long)(in_EDX * in_R8D + local_5c));
          vVar4 = *pvVar6;
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                             (in_RSI,(long)(in_ECX * in_R8D + local_5c));
          vVar5 = *pvVar6;
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                             (in_RSI,(long)(in_EDX * in_R8D + local_5c));
          *pvVar6 = vVar5;
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                             (in_RSI,(long)(in_ECX * in_R8D + local_5c));
          *pvVar6 = -vVar4;
        }
      }
      else {
        for (local_4c = 0; local_4c < *(int *)(in_RDI + 0x18); local_4c = local_4c + 1) {
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                             (in_RSI,(long)(in_EDX * in_R8D + local_4c));
          vVar4 = *pvVar6;
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                             (in_RSI,(long)(in_ECX * in_R8D + local_4c));
          vVar5 = *pvVar6;
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                             (in_RSI,(long)(in_EDX * in_R8D + local_4c));
          *pvVar6 = -vVar5;
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                             (in_RSI,(long)(in_ECX * in_R8D + local_4c));
          *pvVar6 = vVar4;
        }
      }
    }
    else if (local_30 <= 0.0) {
      for (local_3c = 0; local_3c < *(int *)(in_RDI + 0x18); local_3c = local_3c + 1) {
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           (in_RSI,(long)(in_EDX * in_R8D + local_3c));
        vVar4 = *pvVar6;
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           (in_RSI,(long)(in_EDX * in_R8D + local_3c));
        *pvVar6 = -vVar4;
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           (in_RSI,(long)(in_ECX * in_R8D + local_3c));
        vVar4 = *pvVar6;
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           (in_RSI,(long)(in_ECX * in_R8D + local_3c));
        *pvVar6 = -vVar4;
      }
    }
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       (in_RSI,(long)(in_ECX * in_R8D + in_EDX));
    *pvVar6 = 0.0;
  }
  return;
}

Assistant:

void eliminate(std::vector<double>& m, HighsInt i, HighsInt j, HighsInt kmax,
                 HighsInt currentk) {
    // i = col, j = row
    if (m[j * kmax + i] == 0.0) {
      return;
    }
    double z = sqrt(m[i * kmax + i] * m[i * kmax + i] +
                    m[j * kmax + i] * m[j * kmax + i]);
    double cos_, sin_;
    if (z == 0) {
      cos_ = 1.0;
      sin_ = 0.0;
    } else {
      cos_ = m[i * kmax + i] / z;
      sin_ = -m[j * kmax + i] / z;
    }

    if (sin_ == 0.0) {
      if (cos_ > 0.0) {
        // nothing
      } else {
        for (HighsInt k = 0; k < current_k; k++) {
          // update entry i and j of column k
          double a_ik = m[i * kmax + k];
          // entry i
          m[i * kmax + k] = -a_ik;
          m[j * kmax + k] = -m[j * kmax + k];
        }
      }
    } else if (cos_ == 0.0) {
      if (sin_ > 0.0) {
        for (HighsInt k = 0; k < current_k; k++) {
          // update entry i and j of column k
          double a_ik = m[i * kmax + k];
          // entry i
          m[i * kmax + k] = -m[j * kmax + k];
          m[j * kmax + k] = a_ik;
        }
      } else {
        for (HighsInt k = 0; k < current_k; k++) {
          // update entry i and j of column k
          double a_ik = m[i * kmax + k];
          // entry i
          m[i * kmax + k] = m[j * kmax + k];
          m[j * kmax + k] = -a_ik;
        }
      }
    } else {
      // #pragma omp parallel for
      for (HighsInt k = 0; k < current_k; k++) {
        // update entry i and j of column k
        double a_ik = m[i * kmax + k];
        // entry i
        m[i * kmax + k] = cos_ * a_ik - sin_ * m[j * kmax + k];
        m[j * kmax + k] = sin_ * a_ik + cos_ * m[j * kmax + k];
      }
    }
    m[j * kmax + i] = 0.0;
  }